

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

void __thiscall OutputStream::writeVaruint(OutputStream *this,uint64_t v)

{
  for (; 0x7f < v; v = v >> 7) {
    (**this->_vptr_OutputStream)(this,(ulong)(byte)((byte)v | 0x80));
  }
  (**this->_vptr_OutputStream)(this,v & 0xff);
  return;
}

Assistant:

void OutputStream::writeVaruint(uint64_t v) {

  while (v > 0x7F) {
    writeByte(0x80 | uint8_t(v & 0x7F));
    v >>= 7;
  }

  writeByte(uint8_t(v));
}